

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

void __thiscall
cfd::TransactionController::TransactionController
          (TransactionController *this,TransactionController *transaction)

{
  string local_30;
  
  AbstractTransactionController::GetHex_abi_cxx11_
            (&local_30,&transaction->super_AbstractTransactionController);
  AbstractTransactionController::AbstractTransactionController
            (&this->super_AbstractTransactionController);
  (this->super_AbstractTransactionController)._vptr_AbstractTransactionController =
       (_func_int **)&PTR__TransactionController_002b30f8;
  cfd::core::Transaction::Transaction(&this->transaction_,(string *)&local_30);
  (this->super_AbstractTransactionController).tx_address_ =
       (AbstractTransaction *)&this->transaction_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

TransactionController::TransactionController(
    const TransactionController& transaction)
    : TransactionController(transaction.GetHex()) {
  // do nothing
}